

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reflector.h
# Opt level: O0

Matrix<60,_60> __thiscall
singular::Reflector<60>::applyFromRightTo<60>(Reflector<60> *this,Matrix<60,_60> *m)

{
  double *pdVar1;
  int iVar2;
  size_type sVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  int in_ECX;
  Matrix<60,_60> *in_RDX;
  void *in_R8;
  double dVar6;
  iterator iVar7;
  iterator __result;
  Vector<double> local_c8;
  undefined1 local_b0 [8];
  Vector<double> dstRow;
  double gMU;
  Vector<const_double> local_60;
  undefined1 local_48 [8];
  Vector<const_double> srcRow;
  int i;
  int offset;
  Matrix<60,_60> *m_local;
  Reflector<60> *this_local;
  Matrix<60,_60> *m2;
  
  Matrix<60,_60>::clone((Matrix<60,_60> *)this,(__fn *)in_RDX,in_RDX,in_ECX,in_R8);
  sVar3 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)m);
  iVar2 = 0x3c - (int)sVar3;
  for (srcRow.delta._4_4_ = 0; srcRow.delta._4_4_ < 0x3c;
      srcRow.delta._4_4_ = srcRow.delta._4_4_ + 1) {
    Matrix<60,_60>::row(&local_60,in_RDX,srcRow.delta._4_4_);
    Vector<const_double>::slice((Vector<const_double> *)local_48,&local_60,(long)iVar2);
    cVar4 = std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)m);
    cVar5 = std::vector<double,_std::allocator<double>_>::end
                      ((vector<double,_std::allocator<double>_> *)m);
    iVar7 = Vector<const_double>::begin((Vector<const_double> *)local_48);
    dstRow.delta = (ptrdiff_t)iVar7.ptr;
    dVar6 = std::
            inner_product<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,singular::Vector<double_const>::general_iterator<double_const>,double>
                      ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        )cVar4._M_current,
                       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        )cVar5._M_current,iVar7,0.0);
    pdVar1 = m[3].pBlock;
    Matrix<60,_60>::row(&local_c8,(Matrix<60,_60> *)this,srcRow.delta._4_4_);
    Vector<double>::slice((Vector<double> *)local_b0,&local_c8,(long)iVar2);
    cVar4 = std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)m);
    cVar5 = std::vector<double,_std::allocator<double>_>::end
                      ((vector<double,_std::allocator<double>_> *)m);
    iVar7 = Vector<const_double>::begin((Vector<const_double> *)local_48);
    __result = Vector<double>::begin((Vector<double> *)local_b0);
    std::
    transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,singular::Vector<double_const>::general_iterator<double_const>,singular::Vector<double>::general_iterator<double>,singular::Reflector<60>::applyFromRightTo<60>(singular::Matrix<60,60>const&)const::_lambda(double,double)_1_>
              ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               cVar4._M_current,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               cVar5._M_current,iVar7,__result,(anon_class_8_1_ba1d47af)(dVar6 * (double)pdVar1));
  }
  return (Matrix<60,_60>)(double *)this;
}

Assistant:

Matrix< M, L > applyFromRightTo(const Matrix< M, L >& m) const {
			// m * H = m - m * gamma * u * u^T
			Matrix< M, L > m2 = m.clone();
			int offset = L - u.size();
			for (int i = 0; i < M; ++i) {
				// caches gamma * m * u
				Vector< const double > srcRow = m.row(i).slice(offset);
				double gMU = std::inner_product(
					this->u.begin(), this->u.end(), srcRow.begin(), 0.0);
				gMU *= this->gamma;
				// m * H = m - gMU * u^T
				Vector< double > dstRow = m2.row(i).slice(offset);
				std::transform(
					this->u.begin(), this->u.end(), srcRow.begin(),
					dstRow.begin(),
					[gMU](double a, double b) {
						return b - gMU * a;
					});
			}
			return m2;
		}